

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA512_Update(SHA_CTX *context,sha_byte *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint usedspace;
  uint freespace;
  size_t len_local;
  sha_byte *data_local;
  SHA_CTX *context_local;
  
  if (len != 0) {
    if ((context == (SHA_CTX *)0x0) || (data == (sha_byte *)0x0)) {
      __assert_fail("context != (SHA_CTX*)0 && data != (sha_byte*)0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                    ,0x579,"void cmSHA512_Update(SHA_CTX *, const sha_byte *, size_t)");
    }
    uVar3 = (context->s512).bitcount[0] >> 3;
    uVar1 = (uint)uVar3 & 0x7f;
    _usedspace = len;
    len_local = (size_t)data;
    if ((uVar3 & 0x7f) != 0) {
      uVar2 = 0x80 - uVar1;
      if (len < uVar2) {
        memcpy((void *)((long)context + (ulong)uVar1 + 0x50),data,len);
        (context->s512).bitcount[0] = len * 8 + (context->s512).bitcount[0];
        if (len << 3 <= (context->s512).bitcount[0]) {
          return;
        }
        (context->s512).bitcount[1] = (context->s512).bitcount[1] + 1;
        return;
      }
      memcpy((void *)((long)context + (ulong)uVar1 + 0x50),data,(ulong)uVar2);
      (context->s512).bitcount[0] = (ulong)(uVar2 * 8) + (context->s512).bitcount[0];
      if ((context->s512).bitcount[0] < (ulong)(uVar2 * 8)) {
        (context->s512).bitcount[1] = (context->s512).bitcount[1] + 1;
      }
      _usedspace = len - uVar2;
      len_local = (size_t)(data + uVar2);
      cmSHA512_Internal_Transform(context,(sha_word64 *)((context->s1).buffer + 0x30));
    }
    for (; 0x7f < _usedspace; _usedspace = _usedspace - 0x80) {
      cmSHA512_Internal_Transform(context,(sha_word64 *)len_local);
      (context->s512).bitcount[0] = (context->s512).bitcount[0] + 0x400;
      if ((context->s512).bitcount[0] < 0x400) {
        (context->s512).bitcount[1] = (context->s512).bitcount[1] + 1;
      }
      len_local = len_local + 0x80;
    }
    if (_usedspace != 0) {
      memcpy((context->s1).buffer + 0x30,(void *)len_local,_usedspace);
      (context->s512).bitcount[0] = _usedspace * 8 + (context->s512).bitcount[0];
      if ((context->s512).bitcount[0] < _usedspace << 3) {
        (context->s512).bitcount[1] = (context->s512).bitcount[1] + 1;
      }
    }
  }
  return;
}

Assistant:

void SHA512_Update(SHA_CTX* context, const sha_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	/* Sanity check: */
	assert(context != (SHA_CTX*)0 && data != (sha_byte*)0);

	usedspace = (unsigned int)((context->s512.bitcount[0] >> 3) % 128);
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = 128 - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(&context->s512.buffer[usedspace], data, freespace);
			ADDINC128(context->s512.bitcount, freespace << 3);
			len -= freespace;
			data += freespace;
			SHA512_Internal_Transform(context, (const sha_word64*)context->s512.buffer);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(&context->s512.buffer[usedspace], data, len);
			ADDINC128(context->s512.bitcount, len << 3);
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= 128) {
		/* Process as many complete blocks as we can */
		SHA512_Internal_Transform(context, (const sha_word64*)data);
		ADDINC128(context->s512.bitcount, 1024);
		len -= 128;
		data += 128;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->s512.buffer, data, len);
		ADDINC128(context->s512.bitcount, len << 3);
	}
	/* Clean up: */
	usedspace = freespace = 0;
}